

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

bool __thiscall spdlog::logger::should_flush_(logger *this,log_msg *msg)

{
  bool local_41;
  __int_type flush_level;
  log_msg *msg_local;
  logger *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_41 = false;
  if ((this->flush_level_).super___atomic_base<int>._M_i <= *(int *)(msg + 8)) {
    local_41 = *(int *)(msg + 8) != 6;
  }
  return local_41;
}

Assistant:

inline bool spdlog::logger::should_flush_(const details::log_msg &msg)
{
    auto flush_level = flush_level_.load(std::memory_order_relaxed);
    return (msg.level >= flush_level) && (msg.level != level::off);
}